

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineForTarget.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
* __thiscall
Machine::TargetsByMachineName_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
           *__return_storage_ptr__,Machine *this,bool meaningful_without_media_only)

{
  Target *this_00;
  Target *this_01;
  Target *this_02;
  Target *this_03;
  Target *this_04;
  Target *this_05;
  Target *this_06;
  Target *this_07;
  Target *this_08;
  Target *this_09;
  Target *this_10;
  Target *this_11;
  Target *this_12;
  Target *this_13;
  Target *this_14;
  Target *this_15;
  Target *this_16;
  Machine machine;
  Machine machine_00;
  Machine machine_01;
  Machine machine_02;
  Machine machine_03;
  Machine machine_04;
  Machine machine_05;
  Machine machine_06;
  Machine machine_07;
  Machine machine_08;
  Machine machine_09;
  Machine machine_10;
  Machine machine_11;
  Machine machine_12;
  Machine machine_13;
  Machine machine_14;
  Machine machine_15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>,_bool>
  pVar1;
  Target *local_678;
  string local_670;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Sega::Target_*>
  local_650;
  _Base_ptr local_628;
  undefined1 local_620;
  Target *local_618;
  string local_610;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Target_*>
  local_5f0;
  _Base_ptr local_5c8;
  undefined1 local_5c0;
  Target *local_5b8;
  string local_5b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Atari2600::Target_*>
  local_590;
  _Base_ptr local_568;
  undefined1 local_560;
  Target *local_558;
  string local_550;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZXSpectrum::Target_*>
  local_530;
  _Base_ptr local_508;
  undefined1 local_500;
  Target *local_4f8;
  string local_4f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZX8081::Target_*>
  local_4d0;
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  Target *local_498;
  string local_490;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Commodore::Target_*>
  local_470;
  _Base_ptr local_448;
  undefined1 local_440;
  Target *local_438;
  string local_430;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::PCCompatible::Target_*>
  local_410;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  Target *local_3d8;
  string local_3d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Oric::Target_*>
  local_3b0;
  _Base_ptr local_388;
  undefined1 local_380;
  Target *local_378;
  string local_370;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::MSX::Target_*>
  local_350;
  _Base_ptr local_328;
  undefined1 local_320;
  Target *local_318;
  string local_310;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Macintosh::Target_*>
  local_2f0;
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  Target *local_2b8;
  string local_2b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Enterprise::Target_*>
  local_290;
  _Base_ptr local_268;
  undefined1 local_260;
  Target *local_258;
  string local_250;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Acorn::Target_*>
  local_230;
  _Base_ptr local_208;
  undefined1 local_200;
  Target *local_1f8;
  string local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AtariST::Target_*>
  local_1d0;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  Target *local_198;
  string local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleIIgs::Target_*>
  local_170;
  _Base_ptr local_148;
  undefined1 local_140;
  Target *local_138;
  string local_130;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleII::Target_*>
  local_110;
  _Base_ptr local_e8;
  undefined1 local_e0;
  Target *local_d8;
  string local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AmstradCPC::Target_*>
  local_b0;
  _Base_ptr local_88;
  undefined1 local_80;
  Target *local_78 [3];
  string local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Amiga::Target_*>
  local_40;
  undefined1 local_12;
  byte local_11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
  *pmStack_10;
  bool meaningful_without_media_only_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
  *options;
  
  local_11 = (byte)this & 1;
  local_12 = 0;
  pmStack_10 = __return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
  ::map(__return_storage_ptr__);
  LongNameForTargetMachine_abi_cxx11_(&local_60,(Machine *)0x5,machine);
  this_00 = (Target *)operator_new(0x90);
  Analyser::Static::Amiga::Target::Target(this_00);
  local_78[0] = this_00;
  std::make_pair<std::__cxx11::string,Analyser::Static::Amiga::Target*>
            (&local_40,&local_60,local_78);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Amiga::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_40);
  local_88 = (_Base_ptr)pVar1.first._M_node;
  local_80 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Amiga::Target_*>
  ::~pair(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  LongNameForTargetMachine_abi_cxx11_(&local_d0,(Machine *)0x0,machine_00);
  this_01 = (Target *)operator_new(0xb0);
  Analyser::Static::AmstradCPC::Target::Target(this_01);
  local_d8 = this_01;
  std::make_pair<std::__cxx11::string,Analyser::Static::AmstradCPC::Target*>
            (&local_b0,&local_d0,&local_d8);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::AmstradCPC::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_b0);
  local_e8 = (_Base_ptr)pVar1.first._M_node;
  local_e0 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AmstradCPC::Target_*>
  ::~pair(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  LongNameForTargetMachine_abi_cxx11_(&local_130,(Machine *)0x1,machine_01);
  this_02 = (Target *)operator_new(0x98);
  Analyser::Static::AppleII::Target::Target(this_02);
  local_138 = this_02;
  std::make_pair<std::__cxx11::string,Analyser::Static::AppleII::Target*>
            (&local_110,&local_130,&local_138);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::AppleII::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_110);
  local_148 = (_Base_ptr)pVar1.first._M_node;
  local_140 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleII::Target_*>
  ::~pair(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  LongNameForTargetMachine_abi_cxx11_(&local_190,(Machine *)0x2,machine_02);
  this_03 = (Target *)operator_new(0x90);
  Analyser::Static::AppleIIgs::Target::Target(this_03);
  local_198 = this_03;
  std::make_pair<std::__cxx11::string,Analyser::Static::AppleIIgs::Target*>
            (&local_170,&local_190,&local_198);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::AppleIIgs::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_170);
  local_1a8 = (_Base_ptr)pVar1.first._M_node;
  local_1a0 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleIIgs::Target_*>
  ::~pair(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  LongNameForTargetMachine_abi_cxx11_(&local_1f0,(Machine *)0x4,machine_03);
  this_04 = (Target *)operator_new(0x90);
  Analyser::Static::AtariST::Target::Target(this_04);
  local_1f8 = this_04;
  std::make_pair<std::__cxx11::string,Analyser::Static::AtariST::Target*>
            (&local_1d0,&local_1f0,&local_1f8);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::AtariST::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_1d0);
  local_208 = (_Base_ptr)pVar1.first._M_node;
  local_200 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AtariST::Target_*>
  ::~pair(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  LongNameForTargetMachine_abi_cxx11_(&local_250,(Machine *)0x7,machine_04);
  this_05 = (Target *)operator_new(0xb0);
  Analyser::Static::Acorn::Target::Target(this_05);
  local_258 = this_05;
  std::make_pair<std::__cxx11::string,Analyser::Static::Acorn::Target*>
            (&local_230,&local_250,&local_258);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Acorn::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_230);
  local_268 = (_Base_ptr)pVar1.first._M_node;
  local_260 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Acorn::Target_*>
  ::~pair(&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  LongNameForTargetMachine_abi_cxx11_(&local_2b0,(Machine *)0x8,machine_05);
  this_06 = (Target *)operator_new(0xc0);
  Analyser::Static::Enterprise::Target::Target(this_06);
  local_2b8 = this_06;
  std::make_pair<std::__cxx11::string,Analyser::Static::Enterprise::Target*>
            (&local_290,&local_2b0,&local_2b8);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Enterprise::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_290);
  local_2c8 = (_Base_ptr)pVar1.first._M_node;
  local_2c0 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Enterprise::Target_*>
  ::~pair(&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  LongNameForTargetMachine_abi_cxx11_(&local_310,(Machine *)0x9,machine_06);
  this_07 = (Target *)operator_new(0x90);
  Analyser::Static::Macintosh::Target::Target(this_07);
  local_318 = this_07;
  std::make_pair<std::__cxx11::string,Analyser::Static::Macintosh::Target*>
            (&local_2f0,&local_310,&local_318);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Macintosh::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_2f0);
  local_328 = (_Base_ptr)pVar1.first._M_node;
  local_320 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Macintosh::Target_*>
  ::~pair(&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  LongNameForTargetMachine_abi_cxx11_(&local_370,(Machine *)0xb,machine_07);
  this_08 = (Target *)operator_new(0xb8);
  Analyser::Static::MSX::Target::Target(this_08);
  local_378 = this_08;
  std::make_pair<std::__cxx11::string,Analyser::Static::MSX::Target*>
            (&local_350,&local_370,&local_378);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::MSX::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_350);
  local_388 = (_Base_ptr)pVar1.first._M_node;
  local_380 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::MSX::Target_*>
  ::~pair(&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  LongNameForTargetMachine_abi_cxx11_(&local_3d0,(Machine *)0xc,machine_08);
  this_09 = (Target *)operator_new(0xc0);
  Analyser::Static::Oric::Target::Target(this_09);
  local_3d8 = this_09;
  std::make_pair<std::__cxx11::string,Analyser::Static::Oric::Target*>
            (&local_3b0,&local_3d0,&local_3d8);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Oric::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_3b0);
  local_3e8 = (_Base_ptr)pVar1.first._M_node;
  local_3e0 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Oric::Target_*>
  ::~pair(&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  LongNameForTargetMachine_abi_cxx11_(&local_430,(Machine *)0xd,machine_09);
  this_10 = (Target *)operator_new(0x90);
  Analyser::Static::PCCompatible::Target::Target(this_10);
  local_438 = this_10;
  std::make_pair<std::__cxx11::string,Analyser::Static::PCCompatible::Target*>
            (&local_410,&local_430,&local_438);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::PCCompatible::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_410);
  local_448 = (_Base_ptr)pVar1.first._M_node;
  local_440 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::PCCompatible::Target_*>
  ::~pair(&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  LongNameForTargetMachine_abi_cxx11_(&local_490,(Machine *)0xe,machine_10);
  this_11 = (Target *)operator_new(0xb8);
  Analyser::Static::Commodore::Target::Target(this_11);
  local_498 = this_11;
  std::make_pair<std::__cxx11::string,Analyser::Static::Commodore::Target*>
            (&local_470,&local_490,&local_498);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Commodore::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_470);
  local_4a8 = (_Base_ptr)pVar1.first._M_node;
  local_4a0 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Commodore::Target_*>
  ::~pair(&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  LongNameForTargetMachine_abi_cxx11_(&local_4f0,(Machine *)0xf,machine_11);
  this_12 = (Target *)operator_new(0xb0);
  Analyser::Static::ZX8081::Target::Target(this_12);
  local_4f8 = this_12;
  std::make_pair<std::__cxx11::string,Analyser::Static::ZX8081::Target*>
            (&local_4d0,&local_4f0,&local_4f8);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::ZX8081::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_4d0);
  local_508 = (_Base_ptr)pVar1.first._M_node;
  local_500 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZX8081::Target_*>
  ::~pair(&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  LongNameForTargetMachine_abi_cxx11_(&local_550,(Machine *)0x10,machine_12);
  this_13 = (Target *)operator_new(0x90);
  Analyser::Static::ZXSpectrum::Target::Target(this_13);
  local_558 = this_13;
  std::make_pair<std::__cxx11::string,Analyser::Static::ZXSpectrum::Target*>
            (&local_530,&local_550,&local_558);
  pVar1 = std::
          map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
          ::emplace<std::pair<std::__cxx11::string,Analyser::Static::ZXSpectrum::Target*>>
                    ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                      *)__return_storage_ptr__,&local_530);
  local_568 = (_Base_ptr)pVar1.first._M_node;
  local_560 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZXSpectrum::Target_*>
  ::~pair(&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  if ((local_11 & 1) == 0) {
    LongNameForTargetMachine_abi_cxx11_(&local_5b0,(Machine *)0x3,machine_13);
    this_14 = (Target *)operator_new(0x88);
    Analyser::Static::Atari2600::Target::Target(this_14);
    local_5b8 = this_14;
    std::make_pair<std::__cxx11::string,Analyser::Static::Atari2600::Target*>
              (&local_590,&local_5b0,&local_5b8);
    pVar1 = std::
            map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
            ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Atari2600::Target*>>
                      ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                        *)__return_storage_ptr__,&local_590);
    local_5c8 = (_Base_ptr)pVar1.first._M_node;
    local_5c0 = pVar1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Atari2600::Target_*>
    ::~pair(&local_590);
    std::__cxx11::string::~string((string *)&local_5b0);
    LongNameForTargetMachine_abi_cxx11_(&local_610,(Machine *)0x6,machine_14);
    this_15 = (Target *)operator_new(0x80);
    Analyser::Static::Target::Target(this_15,ColecoVision);
    local_618 = this_15;
    std::make_pair<std::__cxx11::string,Analyser::Static::Target*>(&local_5f0,&local_610,&local_618)
    ;
    pVar1 = std::
            map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
            ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Target*>>
                      ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                        *)__return_storage_ptr__,&local_5f0);
    local_628 = (_Base_ptr)pVar1.first._M_node;
    local_620 = pVar1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Target_*>
    ::~pair(&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    LongNameForTargetMachine_abi_cxx11_(&local_670,(Machine *)0xa,machine_15);
    this_16 = (Target *)operator_new(0x98);
    Analyser::Static::Sega::Target::Target(this_16);
    local_678 = this_16;
    std::make_pair<std::__cxx11::string,Analyser::Static::Sega::Target*>
              (&local_650,&local_670,&local_678);
    std::
    map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::emplace<std::pair<std::__cxx11::string,Analyser::Static::Sega::Target*>>
              ((map<std::__cxx11::string,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,&local_650);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Sega::Target_*>
    ::~pair(&local_650);
    std::__cxx11::string::~string((string *)&local_670);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::unique_ptr<Analyser::Static::Target>> Machine::TargetsByMachineName(bool meaningful_without_media_only) {
	std::map<std::string, std::unique_ptr<Analyser::Static::Target>> options;

#define AddMapped(Name, TargetNamespace)	\
	options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::Name), new Analyser::Static::TargetNamespace::Target));
#define Add(Name)	AddMapped(Name, Name)

	Add(Amiga);
	Add(AmstradCPC);
	Add(AppleII);
	Add(AppleIIgs);
	Add(AtariST);
	AddMapped(Electron, Acorn);
	Add(Enterprise);
	Add(Macintosh);
	Add(MSX);
	Add(Oric);
	Add(PCCompatible);
	AddMapped(Vic20, Commodore);
	Add(ZX8081);
	Add(ZXSpectrum);

	if(!meaningful_without_media_only) {
		Add(Atari2600);
		options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::ColecoVision), new Analyser::Static::Target(Analyser::Machine::ColecoVision)));
		AddMapped(MasterSystem, Sega);
	}

#undef Add
#undef AddMapped

	return options;
}